

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void findOrCreateAggInfoColumn(Parse *pParse,AggInfo *pAggInfo,Expr *pExpr)

{
  short sVar1;
  u16 uVar2;
  int iVar3;
  ExprList *pEVar4;
  Expr *pEVar5;
  AggInfo_col *pAVar6;
  ExprList_item *pEVar7;
  uint uVar8;
  ulong uVar9;
  i16 *piVar10;
  int iVar11;
  long in_FS_OFFSET;
  int i;
  int local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < pAggInfo->nColumn) {
    piVar10 = &pAggInfo->aCol->iColumn;
    uVar9 = 0;
    do {
      if (*(Expr **)(piVar10 + -6) == pExpr) goto LAB_001a408a;
      if (((*(int *)(piVar10 + -2) == pExpr->iTable) && (*piVar10 == pExpr->iColumn)) &&
         (pExpr->op != 0xb3)) goto LAB_001a407a;
      uVar8 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar8;
      piVar10 = piVar10 + 0xc;
    } while (pAggInfo->nColumn != uVar8);
  }
  local_24 = -0x55555556;
  pAVar6 = (AggInfo_col *)
           sqlite3ArrayAllocate(pParse->db,pAggInfo->aCol,0x18,&pAggInfo->nColumn,&local_24);
  pAggInfo->aCol = pAVar6;
  uVar9 = (ulong)local_24;
  if (-1 < (long)uVar9) {
    *(anon_union_8_3_c79b3df9_for_y *)(pAVar6 + uVar9) = pExpr->y;
    iVar3 = pExpr->iTable;
    pAVar6[uVar9].iTable = iVar3;
    sVar1 = pExpr->iColumn;
    pAVar6[uVar9].iColumn = sVar1;
    pAVar6[uVar9].iSorterColumn = -1;
    pAVar6[uVar9].pCExpr = pExpr;
    pEVar4 = pAggInfo->pGroupBy;
    if (((pEVar4 != (ExprList *)0x0) && (pExpr->op != 0xb3)) && (0 < pEVar4->nExpr)) {
      pEVar7 = pEVar4->a;
      iVar11 = 0;
      do {
        pEVar5 = pEVar7->pExpr;
        if (((pEVar5->op == 0xa8) && (pEVar5->iTable == iVar3)) && (pEVar5->iColumn == sVar1)) {
          pAVar6[uVar9].iSorterColumn = (i16)iVar11;
          break;
        }
        iVar11 = iVar11 + 1;
        pEVar7 = pEVar7 + 1;
      } while (pEVar4->nExpr != iVar11);
    }
    if (pAVar6[uVar9].iSorterColumn < 0) {
      uVar2 = pAggInfo->nSortingColumn;
      pAggInfo->nSortingColumn = uVar2 + 1;
      pAVar6[uVar9].iSorterColumn = uVar2;
    }
LAB_001a407a:
    pExpr->pAggInfo = pAggInfo;
    if (pExpr->op == 0xa8) {
      pExpr->op = 0xaa;
    }
    pExpr->iAgg = (i16)uVar9;
  }
LAB_001a408a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void findOrCreateAggInfoColumn(
  Parse *pParse,       /* Parsing context */
  AggInfo *pAggInfo,   /* The AggInfo object to search and/or modify */
  Expr *pExpr          /* Expr describing the column to find or insert */
){
  struct AggInfo_col *pCol;
  int k;

  assert( pAggInfo->iFirstReg==0 );
  pCol = pAggInfo->aCol;
  for(k=0; k<pAggInfo->nColumn; k++, pCol++){
    if( pCol->pCExpr==pExpr ) return;
    if( pCol->iTable==pExpr->iTable
     && pCol->iColumn==pExpr->iColumn
     && pExpr->op!=TK_IF_NULL_ROW
    ){
      goto fix_up_expr;
    }
  }
  k = addAggInfoColumn(pParse->db, pAggInfo);
  if( k<0 ){
    /* OOM on resize */
    assert( pParse->db->mallocFailed );
    return;
  }
  pCol = &pAggInfo->aCol[k];
  assert( ExprUseYTab(pExpr) );
  pCol->pTab = pExpr->y.pTab;
  pCol->iTable = pExpr->iTable;
  pCol->iColumn = pExpr->iColumn;
  pCol->iSorterColumn = -1;
  pCol->pCExpr = pExpr;
  if( pAggInfo->pGroupBy && pExpr->op!=TK_IF_NULL_ROW ){
    int j, n;
    ExprList *pGB = pAggInfo->pGroupBy;
    struct ExprList_item *pTerm = pGB->a;
    n = pGB->nExpr;
    for(j=0; j<n; j++, pTerm++){
      Expr *pE = pTerm->pExpr;
      if( pE->op==TK_COLUMN
       && pE->iTable==pExpr->iTable
       && pE->iColumn==pExpr->iColumn
      ){
        pCol->iSorterColumn = j;
        break;
      }
    }
  }
  if( pCol->iSorterColumn<0 ){
    pCol->iSorterColumn = pAggInfo->nSortingColumn++;
  }
fix_up_expr:
  ExprSetVVAProperty(pExpr, EP_NoReduce);
  assert( pExpr->pAggInfo==0 || pExpr->pAggInfo==pAggInfo );
  pExpr->pAggInfo = pAggInfo;
  if( pExpr->op==TK_COLUMN ){
    pExpr->op = TK_AGG_COLUMN;
  }
  pExpr->iAgg = (i16)k;
}